

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.h
# Opt level: O2

void __thiscall libDAI::MF::MF(MF *this,MF *x)

{
  size_t sVar1;
  size_t sVar2;
  double dVar3;
  
  DAIAlg<libDAI::FactorGraph>::DAIAlg(&this->super_DAIAlgFG,&x->super_DAIAlgFG);
  (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_0061f5f0;
  sVar1 = (x->Props).maxiter;
  sVar2 = (x->Props).verbose;
  dVar3 = (x->Props).damping;
  (this->Props).tol = (x->Props).tol;
  (this->Props).maxiter = sVar1;
  (this->Props).verbose = sVar2;
  (this->Props).damping = dVar3;
  this->_maxdiff = x->_maxdiff;
  this->_iterations = x->_iterations;
  std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::vector
            (&this->_beliefs,&x->_beliefs);
  return;
}

Assistant:

MF & operator=( const MF & x ) {
                if( this != &x ) {
                    DAIAlgFG::operator=( x );
                    Props        = x.Props;
                    _maxdiff     = x._maxdiff;
                    _iterations  = x._iterations;
                    _beliefs     = x._beliefs;
                }
                return *this;
            }